

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall kj::HttpServer::drain(HttpServer *this)

{
  undefined8 *puVar1;
  long *plVar2;
  WeakFulfiller<void> *params;
  long in_RSI;
  Fault f;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_37;
  
  _kjCondition.value = (bool)(*(byte *)(in_RSI + 0x70) ^ 1);
  if (*(byte *)(in_RSI + 0x70) == 0) {
    *(undefined1 *)(in_RSI + 0x70) = 1;
    (**(code **)(**(long **)(in_RSI + 0x90) + 0x10))(*(long **)(in_RSI + 0x90),&f);
    if (*(int *)(in_RSI + 0x98) == 0) {
      kj::_::readyNow();
      (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)f.exception;
    }
    else {
      params = (WeakFulfiller<void> *)operator_new(0x18);
      (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
      (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
           (_func_int **)&PTR_reject_00629ab8;
      (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
           (_func_int **)&PTR_disposeImpl_00629af0;
      kj::_::PromiseDisposer::
      alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
                ((PromiseDisposer *)&_kjCondition,params);
      f.exception = (Exception *)CONCAT71(uStack_37,_kjCondition.value);
      puVar1 = *(undefined8 **)(in_RSI + 0xa0);
      plVar2 = *(long **)(in_RSI + 0xa8);
      *(WeakFulfillerBase **)(in_RSI + 0xa0) = &params->super_WeakFulfillerBase;
      *(WeakFulfiller<void> **)(in_RSI + 0xa8) = params;
      if (plVar2 != (long *)0x0) {
        (**(code **)*puVar1)(puVar1,(long)plVar2 + *(long *)(*plVar2 + -0x10));
      }
      (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)f.exception;
    }
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[31]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1fcb,FAILED,"!draining","_kjCondition,\"you can only call drain() once\"",
             &_kjCondition,(char (*) [31])"you can only call drain() once");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Promise<void> HttpServer::drain() {
  KJ_REQUIRE(!draining, "you can only call drain() once");

  draining = true;
  drainFulfiller->fulfill();

  if (connectionCount == 0) {
    return kj::READY_NOW;
  } else {
    auto paf = kj::newPromiseAndFulfiller<void>();
    zeroConnectionsFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}